

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O2

int fficls(fitsfile *fptr,int fstcol,int ncols,char **ttype,char **tform,int *status)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  long nbytes;
  long lVar7;
  ulong uVar8;
  long lVar9;
  FITSfile *pFVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  int datacode;
  ulong local_1f0;
  uint local_1e4;
  long width;
  LONGLONG tbcol;
  LONGLONG local_1d0;
  long local_1c8;
  long repeat;
  int local_1b4;
  int local_1b0;
  int decims;
  char comm [73];
  int tstatus;
  char tfm [71];
  char keyname [75];
  char card [81];
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar1 = ffrdef(fptr,status), 0 < iVar1))
    goto LAB_0011385f;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (fptr->Fptr->hdutype == 0) {
    ffpmsg("Can only add columns to TABLE or BINTABLE extension (fficls)");
    *status = 0xeb;
    return 0xeb;
  }
  if (fstcol < 1) {
    *status = 0x12e;
    return 0x12e;
  }
  uVar13 = fptr->Fptr->tfield;
  local_1f0 = (ulong)uVar13;
  local_1b0 = uVar13 + 1;
  local_1b4 = fstcol;
  if ((int)uVar13 < fstcol) {
    local_1b4 = local_1b0;
  }
  uVar8 = 0;
  uVar2 = 0;
  if (0 < ncols) {
    uVar2 = (ulong)(uint)ncols;
  }
  lVar12 = 0;
  local_1e4 = fstcol;
  for (; uVar2 != uVar8; uVar8 = uVar8 + 1) {
    pcVar4 = tform[uVar8];
    sVar3 = strlen(pcVar4);
    if (0x46 < sVar3) {
      ffpmsg("Column format string too long (fficls)");
      *status = 0x105;
      return 0x105;
    }
    strcpy(tfm,pcVar4);
    ffupch(tfm);
    if (fptr->Fptr->hdutype == 1) {
      ffasfm(tfm,&datacode,&width,&decims,status);
      lVar5 = width + 1;
    }
    else {
      ffbnfm(tfm,&datacode,&repeat,&width,status);
      if (datacode < 0) {
        pcVar4 = strchr(tfm,0x51);
        lVar5 = (ulong)(pcVar4 != (char *)0x0) * 8 + 8;
      }
      else {
        lVar5 = repeat;
        if (datacode != 0x10) {
          if (datacode == 1) {
            lVar5 = (repeat + 7) / 8;
          }
          else {
            lVar5 = ((ulong)(uint)datacode / 10) * repeat;
          }
        }
      }
    }
    lVar12 = lVar12 + lVar5;
  }
  if (0 < *status) {
    return *status;
  }
  pFVar10 = fptr->Fptr;
  lVar5 = pFVar10->numrows;
  local_1d0 = pFVar10->rowlength;
  nbytes = pFVar10->heapsize;
  lVar7 = (pFVar10->heapstart + nbytes + 0xb3f) % 0xb40;
  lVar9 = lVar5 * lVar12;
  if (0xb3f - lVar7 < lVar9) {
    iVar1 = ffiblk(fptr,(lVar7 + lVar9) / 0xb40,1,status);
    if (0 < iVar1) goto LAB_0011385f;
    pFVar10 = fptr->Fptr;
    nbytes = pFVar10->heapsize;
  }
  if (0 < nbytes) {
    iVar1 = ffshft(fptr,pFVar10->heapstart + pFVar10->datastart,nbytes,lVar9,status);
    if (0 < iVar1) goto LAB_0011385f;
    pFVar10 = fptr->Fptr;
  }
  lVar9 = lVar9 + pFVar10->heapstart;
  pFVar10->heapstart = lVar9;
  tstatus = 0;
  ffmkyj(fptr,"THEAP",lVar9,"&",&tstatus);
  local_1c8 = local_1d0;
  if ((int)local_1e4 <= (int)local_1f0) {
    local_1c8 = fptr->Fptr->tableptr[(ulong)local_1e4 - 1].tbcol;
  }
  ffcins(fptr,local_1d0,lVar5,lVar12,local_1c8,status);
  if (fptr->Fptr->hdutype == 1) {
    iVar1 = 0;
    if (0 < (int)local_1f0) {
      iVar1 = (int)local_1f0;
    }
    for (iVar11 = 1; iVar11 - iVar1 != 1; iVar11 = iVar11 + 1) {
      ffkeyn("TBCOL",iVar11,keyname,status);
      ffgkyjj(fptr,keyname,&tbcol,comm,status);
      if (local_1c8 < tbcol) {
        tbcol = tbcol + lVar12;
        ffmkyj(fptr,keyname,tbcol,"&",status);
      }
    }
  }
  iVar1 = (int)local_1f0;
  ffmkyj(fptr,"TFIELDS",(long)(iVar1 + ncols),"&",status);
  ffmkyj(fptr,"NAXIS1",local_1d0 + lVar12,"&",status);
  if ((int)local_1e4 <= iVar1) {
    ffkshf(fptr,local_1e4,iVar1,ncols,status);
  }
  iVar1 = local_1b4;
  for (uVar8 = 0; uVar8 != uVar2; uVar8 = uVar8 + 1) {
    builtin_strncpy(comm,"label for field",0x10);
    ffkeyn("TTYPE",iVar1,keyname,status);
    ffpkys(fptr,keyname,ttype[uVar8],comm,status);
    builtin_strncpy(comm,"format of field",0x10);
    strcpy(tfm,tform[uVar8]);
    ffupch(tfm);
    ffkeyn("TFORM",iVar1,keyname,status);
    iVar11 = -datacode;
    if (0 < datacode) {
      iVar11 = datacode;
    }
    if (iVar11 == 0xc) {
      pcVar4 = tfm;
      do {
        pcVar6 = pcVar4;
        pcVar4 = pcVar6 + 1;
      } while (*pcVar6 != 'S');
      *pcVar6 = 'B';
      ffpkys(fptr,keyname,tfm,comm,status);
      ffkeyn("TZERO",iVar1,keyname,status);
      builtin_strncpy(comm + 0x10,"d bytes",8);
      builtin_strncpy(comm + 10," signe",6);
      uVar13 = 0xc0600000;
LAB_00113f8b:
      builtin_strncpy(comm,"offset for",10);
      ffpkyg(fptr,keyname,(double)((ulong)uVar13 << 0x20),0,comm,status);
      ffkeyn("TSCAL",iVar1,keyname,status);
LAB_00113fc9:
      builtin_strncpy(comm,"data are not scaled",0x14);
      ffpkyg(fptr,keyname,1.0,0,comm,status);
    }
    else {
      if (iVar11 == 0x14) {
        pcVar4 = tfm;
        do {
          pcVar6 = pcVar4;
          pcVar4 = pcVar6 + 1;
        } while (*pcVar6 != 'U');
        *pcVar6 = 'I';
        ffpkys(fptr,keyname,tfm,comm,status);
        ffkeyn("TZERO",iVar1,keyname,status);
        builtin_strncpy(comm + 10," unsigned integers",0x13);
        uVar13 = 0x40e00000;
        goto LAB_00113f8b;
      }
      if (iVar11 == 0x28) {
        pcVar4 = tfm;
        do {
          pcVar6 = pcVar4;
          pcVar4 = pcVar6 + 1;
        } while (*pcVar6 != 'V');
        *pcVar6 = 'J';
        ffpkys(fptr,keyname,tfm,comm,status);
        ffkeyn("TZERO",iVar1,keyname,status);
        builtin_strncpy(comm + 10," unsigned integers",0x13);
        uVar13 = 0x41e00000;
        goto LAB_00113f8b;
      }
      if (iVar11 == 0x50) {
        pcVar4 = tfm;
        do {
          pcVar6 = pcVar4;
          pcVar4 = pcVar6 + 1;
        } while (*pcVar6 != 'W');
        *pcVar6 = 'K';
        ffpkys(fptr,keyname,tfm,comm,status);
        ffkeyn("TZERO",iVar1,card,status);
        sVar3 = strlen(card);
        builtin_strncpy(card + sVar3,"     ",6);
        card[8] = '\0';
        sVar3 = strlen(card);
        builtin_strncpy(card + sVar3,"=  9223372036854775808 / offset for unsigned integers",0x36);
        ffprec(fptr,card,status);
        ffkeyn("TSCAL",iVar1,keyname,status);
        goto LAB_00113fc9;
      }
      ffpkys(fptr,keyname,tfm,comm,status);
    }
    lVar12 = local_1c8;
    if (fptr->Fptr->hdutype == 1) {
      tbcol = (ulong)(iVar1 == local_1b0) + 1 + local_1c8;
      builtin_strncpy(comm,"beginning column of field",0x1a);
      local_1f0 = uVar8;
      ffkeyn("TBCOL",iVar1,keyname,status);
      ffpkyj(fptr,keyname,tbcol,comm,status);
      ffasfm(tfm,&datacode,&width,&decims,status);
      local_1c8 = lVar12 + width + 1;
      uVar8 = local_1f0;
    }
    iVar1 = iVar1 + 1;
  }
  ffrdef(fptr,status);
LAB_0011385f:
  return *status;
}

Assistant:

int fficls(fitsfile *fptr,  /* I - FITS file pointer                        */
           int fstcol,      /* I - position for first new col. (1 = 1st)    */
           int ncols,       /* I - number of columns to insert              */
           char **ttype,    /* I - array of column names(TTYPE keywords)    */
           char **tform,    /* I - array of formats of column (TFORM)       */
           int *status)     /* IO - error status                            */
/*
 Insert 1 or more new columns into an existing table at position numcol.  If
 fstcol is greater than the number of existing columns in the table
 then the new column will be appended as the last column in the table.
*/
{
    int colnum, datacode, decims, tfields, tstatus, ii;
    LONGLONG datasize, firstbyte, nbytes, nadd, naxis1, naxis2, freespace;
    LONGLONG tbcol, firstcol, delbyte;
    long nblock, width, repeat;
    char tfm[FLEN_VALUE], keyname[FLEN_KEYWORD], comm[FLEN_COMMENT], *cptr;
    char card[FLEN_CARD];
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
        /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
       ffpmsg("Can only add columns to TABLE or BINTABLE extension (fficls)");
       return(*status = NOT_TABLE);
    }

    /*  is the column number valid?  */
    tfields = (fptr->Fptr)->tfield;
    if (fstcol < 1 )
        return(*status = BAD_COL_NUM);
    else if (fstcol > tfields)
        colnum = tfields + 1;   /* append as last column */
    else
        colnum = fstcol;

    /* parse the tform value and calc number of bytes to add to each row */
    delbyte = 0;
    for (ii = 0; ii < ncols; ii++)
    {
        if (strlen(tform[ii]) > FLEN_VALUE-1)
        {
           ffpmsg("Column format string too long (fficls)");
           return (*status=BAD_TFORM);
        }
        strcpy(tfm, tform[ii]);
        ffupch(tfm);         /* make sure format is in upper case */

        if ((fptr->Fptr)->hdutype == ASCII_TBL)
        {
            ffasfm(tfm, &datacode, &width, &decims, status);
            delbyte += width + 1;  /*  add one space between the columns */
        }
        else
        {
            ffbnfm(tfm, &datacode, &repeat, &width, status);

            if (datacode < 0)  {       /* variable length array column */
	        if (strchr(tfm, 'Q'))
		  delbyte += 16;
		else
                  delbyte += 8;
            } else if (datacode == 1)          /* bit column; round up  */
                delbyte += (repeat + 7) / 8; /* to multiple of 8 bits */
            else if (datacode == 16)  /* ASCII string column */
                delbyte += repeat;
            else                      /* numerical data type */
                delbyte += (datacode / 10) * repeat;
        }
    }

    if (*status > 0) 
        return(*status);

    /* get the current size of the table */
    /* use internal structure since NAXIS2 keyword may not be up to date */
    naxis1 = (fptr->Fptr)->rowlength;
    naxis2 = (fptr->Fptr)->numrows;

    /* current size of data */
    datasize = (fptr->Fptr)->heapstart + (fptr->Fptr)->heapsize;
    freespace = ( ( (datasize + 2879) / 2880) * 2880) - datasize;
    nadd = delbyte * naxis2;   /* no. of bytes to add to table */

    if ( (freespace - nadd) < 0)   /* not enough existing space? */
    {
        nblock = (long) ((nadd - freespace + 2879) / 2880);     /* number of blocks  */
        if (ffiblk(fptr, nblock, 1, status) > 0)       /* insert the blocks */
            return(*status);
    }

    /* shift heap down (if it exists) */
    if ((fptr->Fptr)->heapsize > 0)
    {
        nbytes = (fptr->Fptr)->heapsize;    /* no. of bytes to shift down */

        /* absolute heap pos */
        firstbyte = (fptr->Fptr)->datastart + (fptr->Fptr)->heapstart;

        if (ffshft(fptr, firstbyte, nbytes, nadd, status) > 0) /* move heap */
            return(*status);
    }

    /* update the heap starting address */
    (fptr->Fptr)->heapstart += nadd;

    /* update the THEAP keyword if it exists */
    tstatus = 0;
    ffmkyj(fptr, "THEAP", (fptr->Fptr)->heapstart, "&", &tstatus);

    /* calculate byte position in the row where to insert the new column */
    if (colnum > tfields)
        firstcol = naxis1;
    else
    {
        colptr = (fptr->Fptr)->tableptr;
        colptr += (colnum - 1);
        firstcol = colptr->tbcol;
    }

    /* insert delbyte bytes in every row, at byte position firstcol */
    ffcins(fptr, naxis1, naxis2, delbyte, firstcol, status);

    if ((fptr->Fptr)->hdutype == ASCII_TBL)
    {
        /* adjust the TBCOL values of the existing columns */
        for(ii = 0; ii < tfields; ii++)
        {
            ffkeyn("TBCOL", ii + 1, keyname, status);
            ffgkyjj(fptr, keyname, &tbcol, comm, status);
            if (tbcol > firstcol)
            {
                tbcol += delbyte;
                ffmkyj(fptr, keyname, tbcol, "&", status);
            }
        }
    }

    /* update the mandatory keywords */
    ffmkyj(fptr, "TFIELDS", tfields + ncols, "&", status);
    ffmkyj(fptr, "NAXIS1", naxis1 + delbyte, "&", status);

    /* increment the index value on any existing column keywords */
    if(colnum <= tfields)
        ffkshf(fptr, colnum, tfields, ncols, status);

    /* add the required keywords for the new columns */
    for (ii = 0; ii < ncols; ii++, colnum++)
    {
        strcpy(comm, "label for field");
        ffkeyn("TTYPE", colnum, keyname, status);
        ffpkys(fptr, keyname, ttype[ii], comm, status);

        strcpy(comm, "format of field");
        strcpy(tfm, tform[ii]);
        ffupch(tfm);         /* make sure format is in upper case */
        ffkeyn("TFORM", colnum, keyname, status);

        if (abs(datacode) == TSBYTE) 
        {
           /* Replace the 'S' with an 'B' in the TFORMn code */
           cptr = tfm;
           while (*cptr != 'S') 
              cptr++;

           *cptr = 'B';
           ffpkys(fptr, keyname, tfm, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", colnum, keyname, status);
           strcpy(comm, "offset for signed bytes");

           ffpkyg(fptr, keyname, -128., 0, comm, status);

           ffkeyn("TSCAL", colnum, keyname, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, keyname, 1., 0, comm, status);
        }
        else if (abs(datacode) == TUSHORT) 
        {
           /* Replace the 'U' with an 'I' in the TFORMn code */
           cptr = tfm;
           while (*cptr != 'U') 
              cptr++;

           *cptr = 'I';
           ffpkys(fptr, keyname, tfm, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", colnum, keyname, status);
           strcpy(comm, "offset for unsigned integers");

           ffpkyg(fptr, keyname, 32768., 0, comm, status);

           ffkeyn("TSCAL", colnum, keyname, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, keyname, 1., 0, comm, status);
        }
        else if (abs(datacode) == TULONG) 
        {
           /* Replace the 'V' with an 'J' in the TFORMn code */
           cptr = tfm;
           while (*cptr != 'V') 
              cptr++;

           *cptr = 'J';
           ffpkys(fptr, keyname, tfm, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", colnum, keyname, status);
           strcpy(comm, "offset for unsigned integers");

           ffpkyg(fptr, keyname, 2147483648., 0, comm, status);

           ffkeyn("TSCAL", colnum, keyname, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, keyname, 1., 0, comm, status);
        }
        else if (abs(datacode) == TULONGLONG) 
        {	   
           /* Replace the 'W' with an 'K' in the TFORMn code */
           cptr = tfm;
           while (*cptr != 'W') 
              cptr++;

           *cptr = 'K';
           ffpkys(fptr, keyname, tfm, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", colnum, card, status);
           strcat(card, "     ");  /* make sure name is >= 8 chars long */
           *(card+8) = '\0';
	   strcat(card, "=  9223372036854775808 / offset for unsigned integers");
	   fits_write_record(fptr, card, status);

           ffkeyn("TSCAL", colnum, keyname, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, keyname, 1., 0, comm, status);
        }
        else
        {
           ffpkys(fptr, keyname, tfm, comm, status);
        }

        if ((fptr->Fptr)->hdutype == ASCII_TBL)   /* write the TBCOL keyword */
        {
            if (colnum == tfields + 1)
                tbcol = firstcol + 2;  /* allow space between preceding col */
            else
                tbcol = firstcol + 1;

            strcpy(comm, "beginning column of field");
            ffkeyn("TBCOL", colnum, keyname, status);
            ffpkyj(fptr, keyname, tbcol, comm, status);

            /* increment the column starting position for the next column */
            ffasfm(tfm, &datacode, &width, &decims, status);
            firstcol += width + 1;  /*  add one space between the columns */
        }
    }
    ffrdef(fptr, status); /* initialize the new table structure */
    return(*status);
}